

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O1

t_namelist * namelist_append(t_namelist *listwas,char *s,int allowdup)

{
  char cVar1;
  _namelist *p_Var2;
  int iVar3;
  t_namelist *ptVar4;
  size_t sVar5;
  char *pcVar6;
  t_namelist *ptVar7;
  
  ptVar4 = (t_namelist *)getbytes(0x10);
  ptVar4->nl_next = (_namelist *)0x0;
  sVar5 = strlen(s);
  pcVar6 = (char *)getbytes(sVar5 + 1);
  ptVar4->nl_string = pcVar6;
  strcpy(pcVar6,s);
  cVar1 = *ptVar4->nl_string;
  pcVar6 = ptVar4->nl_string;
  while (cVar1 != '\0') {
    *pcVar6 = cVar1;
    cVar1 = pcVar6[1];
    pcVar6 = pcVar6 + 1;
  }
  *pcVar6 = '\0';
  p_Var2 = listwas;
  if (listwas != (t_namelist *)0x0) {
    do {
      ptVar7 = p_Var2;
      if ((allowdup == 0) && (iVar3 = strcmp(ptVar7->nl_string,s), iVar3 == 0)) {
        pcVar6 = ptVar4->nl_string;
        sVar5 = strlen(pcVar6);
        freebytes(pcVar6,sVar5 + 1);
        return listwas;
      }
      p_Var2 = ptVar7->nl_next;
    } while (ptVar7->nl_next != (_namelist *)0x0);
    ptVar7->nl_next = ptVar4;
    ptVar4 = listwas;
  }
  return ptVar4;
}

Assistant:

t_namelist *namelist_append(t_namelist *listwas, const char *s, int allowdup)
{
    t_namelist *nl, *nl2;
    nl2 = (t_namelist *)(getbytes(sizeof(*nl)));
    nl2->nl_next = 0;
    nl2->nl_string = (char *)getbytes(strlen(s) + 1);
    strcpy(nl2->nl_string, s);
    sys_unbashfilename(nl2->nl_string, nl2->nl_string);
    if (!listwas)
        return (nl2);
    else
    {
        for (nl = listwas; ;)
        {
            if (!allowdup && !strcmp(nl->nl_string, s))
            {
                freebytes(nl2->nl_string, strlen(nl2->nl_string) + 1);
                return (listwas);
            }
            if (!nl->nl_next)
                break;
            nl = nl->nl_next;
        }
        nl->nl_next = nl2;
    }
    return (listwas);
}